

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_control.c
# Opt level: O0

int mixed_make_segment_volume_control(float volume,float pan,mixed_segment *segment)

{
  void *pvVar1;
  volume_control_segment_data *data;
  mixed_segment *segment_local;
  float pan_local;
  float volume_local;
  
  pvVar1 = (*mixed_calloc)(1,0x28);
  if (pvVar1 != (void *)0x0) {
    *(float *)((long)pvVar1 + 0x20) = volume;
    *(float *)((long)pvVar1 + 0x24) = pan;
    segment->free = volume_control_segment_free;
    segment->start = volume_control_segment_start;
    segment->mix = volume_control_segment_mix;
    segment->set_in = volume_control_segment_set_in;
    segment->set_out = volume_control_segment_set_out;
    segment->info = volume_control_segment_info;
    segment->get = volume_control_segment_get;
    segment->set = volume_control_segment_set;
    segment->data = pvVar1;
  }
  else {
    mixed_err(1);
  }
  pan_local = (float)(uint)(pvVar1 != (void *)0x0);
  return (int)pan_local;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_volume_control(float volume, float pan, struct mixed_segment *segment){
  struct volume_control_segment_data *data = mixed_calloc(1, sizeof(struct volume_control_segment_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  data->volume = volume;
  data->pan = pan;
  
  segment->free = volume_control_segment_free;
  segment->start = volume_control_segment_start;
  segment->mix = volume_control_segment_mix;
  segment->set_in = volume_control_segment_set_in;
  segment->set_out = volume_control_segment_set_out;
  segment->info = volume_control_segment_info;
  segment->get = volume_control_segment_get;
  segment->set = volume_control_segment_set;
  segment->data = data;
  return 1;
}